

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O1

string * pstore::logger::to_string<unsigned_int>
                   (string *__return_storage_ptr__,czstring message,uint t)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  size_type *psVar6;
  uint uVar7;
  string __str;
  long *local_48;
  uint local_40;
  long local_38 [2];
  
  cVar4 = '\x01';
  if (9 < t) {
    uVar7 = t;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar7 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0016711a;
      }
      if (uVar7 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0016711a;
      }
      if (uVar7 < 10000) goto LAB_0016711a;
      bVar1 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_0016711a:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_48,local_40,t);
  strlen(message);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)message);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string (gsl::czstring const message, T const t) {
                return message + std::to_string (t);
            }